

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_factory.cc
# Opt level: O0

shared_ptr<lf::mesh::Mesh> __thiscall lf::mesh::hybrid2d::MeshFactory::Build(MeshFactory *this)

{
  dim_t dim_world;
  bool bVar1;
  __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  Mesh *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  MeshFactory *in_RSI;
  shared_ptr<lf::mesh::Mesh> sVar4;
  vector<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
  local_298;
  vector<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
  local_280;
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  local_268;
  undefined1 local_249;
  vector<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
  local_248;
  vector<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
  local_230;
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  local_218;
  Mesh *local_200;
  Mesh *mesh_ptr;
  basic_string_view<char> local_1d8;
  source_loc local_1c8;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [384];
  MeshFactory *this_local;
  
  this_local = this;
  p_Var2 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)Logger()
  ;
  peVar3 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var2);
  bVar1 = spdlog::logger::should_log(peVar3,trace);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    PrintLists(in_RSI,local_190);
    p_Var2 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             Logger();
    peVar3 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var2);
    spdlog::source_loc::source_loc
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
               ,0x6e,"Build");
    std::__cxx11::stringstream::str();
    ::fmt::v10::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              (&local_1d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mesh_ptr);
    spdlog::logger::log(peVar3,(double)local_1c8.filename);
    std::__cxx11::string::~string((string *)&mesh_ptr);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  this_00 = (Mesh *)operator_new(0xb8);
  local_249 = 1;
  dim_world = in_RSI->dim_world_;
  std::
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  ::vector(&local_218,&in_RSI->nodes_);
  std::
  vector<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
  ::vector(&local_230,&in_RSI->edges_);
  std::
  vector<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
  ::vector(&local_248,&in_RSI->elements_);
  Mesh::Mesh(this_00,dim_world,&local_218,&local_230,&local_248,
             (bool)(in_RSI->check_completeness_ & 1));
  local_249 = 0;
  std::
  vector<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
  ::~vector(&local_248);
  std::
  vector<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
  ::~vector(&local_230);
  std::
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  ::~vector(&local_218);
  local_200 = this_00;
  memset(&local_268,0,0x18);
  std::
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  ::vector(&local_268);
  std::
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  ::operator=(&in_RSI->nodes_,&local_268);
  std::
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  ::~vector(&local_268);
  memset(&local_280,0,0x18);
  std::
  vector<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
  ::vector(&local_280);
  std::
  vector<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
  ::operator=(&in_RSI->edges_,&local_280);
  std::
  vector<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
  ::~vector(&local_280);
  memset(&local_298,0,0x18);
  std::
  vector<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
  ::vector(&local_298);
  std::
  vector<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
  ::operator=(&in_RSI->elements_,&local_298);
  std::
  vector<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
  ::~vector(&local_298);
  std::shared_ptr<lf::mesh::Mesh>::shared_ptr<lf::mesh::Mesh,void>
            ((shared_ptr<lf::mesh::Mesh> *)this,&local_200->super_Mesh);
  sVar4.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<lf::mesh::Mesh>)
         sVar4.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<mesh::Mesh> MeshFactory::Build() {
  // DIAGNOSTICS
  if (Logger()->should_log(spdlog::level::trace)) {
    std::stringstream ss;
    PrintLists(ss);
    SPDLOG_LOGGER_TRACE(Logger(), ss.str());
  }

  // Obtain points to new mesh object; the actual construction of the
  // mesh is done by the constructor of that object
  mesh::Mesh* mesh_ptr =
      new hybrid2d::Mesh(dim_world_, std::move(nodes_), std::move(edges_),
                         std::move(elements_), check_completeness_);

  // Clear all information supplied to the MeshFactory object
  nodes_ = hybrid2d::Mesh::NodeCoordList{};  // .clear();
  edges_ = hybrid2d::Mesh::EdgeList{};       // .clear();
  elements_ = hybrid2d::Mesh::CellList{};    // clear();

  return std::shared_ptr<mesh::Mesh>(mesh_ptr);
}